

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mobilitymodel.cpp
# Opt level: O3

void rev_calc(double longitude,double latitude,double height,double *res)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ostream *poVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar12;
  double dStack_70;
  
  dVar12 = sin(latitude);
  dVar3 = sin(latitude);
  dVar12 = dVar12 * -0.0066943799901413165 * dVar3 + 1.0;
  if (dVar12 < 0.0) {
    dVar12 = sqrt(dVar12);
  }
  else {
    dVar12 = SQRT(dVar12);
  }
  dVar3 = 6378137.0 / dVar12 + height;
  dVar4 = cos(latitude);
  dVar5 = cos(longitude);
  dVar6 = cos(latitude);
  dVar7 = sin(longitude);
  dVar8 = sin(latitude);
  dVar8 = dVar8 * ((6378137.0 / dVar12) * 0.9933056200098587 + height);
  dVar5 = dVar5 * dVar3 * dVar4;
  dVar7 = dVar7 * dVar3 * dVar6;
  uVar10 = SUB84(dVar7,0);
  uVar11 = (undefined4)((ulong)dVar7 >> 0x20);
  auVar1._8_4_ = uVar10;
  auVar1._0_8_ = dVar5;
  auVar1._12_4_ = uVar11;
  auVar2._8_4_ = uVar10;
  auVar2._0_8_ = dVar5;
  auVar2._12_4_ = uVar11;
  *(undefined1 (*) [16])res = auVar2;
  res[2] = dVar8;
  poVar9 = std::ostream::_M_insert<double>(dVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t",1);
  dStack_70 = auVar1._8_8_;
  poVar9 = std::ostream::_M_insert<double>(dStack_70);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t",1);
  poVar9 = std::ostream::_M_insert<double>(dVar8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  return;
}

Assistant:

void rev_calc(double longitude, double latitude, double height, double* res){   //将经纬高（WGS84）转化为XYZ
    double _radiusEquator = 6378137;
    double _radiusPolar =  6356752.3142;
    double f = 1/298.257223563;
    double _eccentricitySquared = 2*f - pow(f,2);
    double N = _radiusEquator / sqrt( 1.0 - _eccentricitySquared*sin(latitude)*sin(latitude));
    double X = (N + height)*cos(latitude)*cos(longitude);
    double Y = (N + height)*cos(latitude)*sin(longitude);
    double Z = (N*(1.0-_eccentricitySquared) + height)*sin(latitude);
    res[0] = X;
    res[1] = Y;
    res[2] = Z;
    cout<<X<<"\t"<<Y<<"\t"<<Z<<endl;
}